

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O1

void printS5ImmOperand(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  uint uVar3;
  MCOperand *op;
  int64_t iVar4;
  undefined4 in_register_00000034;
  char *fmt;
  uint uVar5;
  
  op = MCInst_getOperand(MI,1);
  iVar4 = MCOperand_getImm(op);
  uVar5 = ((int)iVar4 << 0x1b) >> 0x1b;
  if ((int)uVar5 < 0) {
    uVar3 = -uVar5;
    if ((int)uVar5 < -9) {
      fmt = "-0x%x";
    }
    else {
      fmt = "-%u";
    }
  }
  else {
    uVar3 = uVar5;
    if ((int)uVar5 < 10) {
      fmt = "%u";
    }
    else {
      fmt = "0x%x";
    }
  }
  SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNo),fmt,(ulong)uVar3);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.addr_size * 0x10 + 0x1a;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.addr_size * 0x10 + 0x1e) = uVar5;
    puVar1 = &(MI->flat_insn->detail->field_6).x86.addr_size;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printS5ImmOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	int Value = (int)MCOperand_getImm(MCInst_getOperand(MI, OpNo));
	Value = SignExtend32(Value, 5);

	if (Value >= 0) {
		if (Value > HEX_THRESHOLD)
			SStream_concat(O, "0x%x", Value);
		else
			SStream_concat(O, "%u", Value);
	} else {
		if (Value < -HEX_THRESHOLD)
			SStream_concat(O, "-0x%x", -Value);
		else
			SStream_concat(O, "-%u", -Value);
	}

	if (MI->csh->detail) {
		MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].type = PPC_OP_IMM;
		MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].imm = Value;
		MI->flat_insn->detail->ppc.op_count++;
	}
}